

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cRGB555,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  ushort uVar2;
  undefined2 uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  FSpecialColormap *pFVar7;
  EBlend EVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  
  pFVar7 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar8 = BLEND_NONE;
  }
  else {
    EVar8 = inf->blend;
  }
  switch(EVar8) {
  case BLEND_NONE:
    if (0 < count) {
      lVar9 = 0;
      do {
        pout[lVar9 * 4 + 2] = (char)*(ushort *)pin << 3;
        pout[lVar9 * 4 + 1] = (byte)(*(ushort *)pin >> 2) & 0xf8;
        pout[lVar9 * 4] = (byte)(*(ushort *)pin >> 7) & 0xf8;
        pout[lVar9 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar9 = lVar9 + 1;
      } while (count != (int)lVar9);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      lVar9 = 0;
      do {
        uVar2 = *(ushort *)pin;
        uVar10 = (uVar2 >> 2 & 0xf8) * 0x8f + ((uint)uVar2 * 8 & 0xff) * 0x4d +
                 (uVar2 >> 7 & 0xf8) * 0x24 >> 0xc;
        BVar1 = IcePalette[uVar10][1];
        pout[lVar9 * 4 + 2] = IcePalette[uVar10][0];
        pout[lVar9 * 4 + 1] = BVar1;
        pout[lVar9 * 4] = IcePalette[uVar10][2];
        pout[lVar9 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar9 = lVar9 + 1;
      } while (count != (int)lVar9);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      lVar9 = 0;
      do {
        uVar2 = *(ushort *)pin;
        iVar12 = inf->blendcolor[3];
        iVar11 = inf->blendcolor[1];
        iVar4 = inf->blendcolor[2];
        pout[lVar9 * 4 + 2] = (BYTE)(((uint)uVar2 * 8 & 0xff) * iVar12 + inf->blendcolor[0] >> 0x10)
        ;
        pout[lVar9 * 4 + 1] = (BYTE)((uVar2 >> 2 & 0xf8) * iVar12 + iVar11 >> 0x10);
        pout[lVar9 * 4] = (BYTE)((uVar2 >> 7 & 0xf8) * iVar12 + iVar4 >> 0x10);
        pout[lVar9 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar9 = lVar9 + 1;
      } while (count != (int)lVar9);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      lVar9 = 0;
      do {
        uVar2 = *(ushort *)pin;
        iVar12 = inf->blendcolor[1];
        iVar11 = inf->blendcolor[2];
        pout[lVar9 * 4 + 2] = (BYTE)(((uint)uVar2 * 8 & 0xff) * inf->blendcolor[0] >> 0x10);
        pout[lVar9 * 4 + 1] = (BYTE)((uVar2 >> 2 & 0xf8) * iVar12 >> 0x10);
        pout[lVar9 * 4] = (BYTE)((uVar2 >> 7 & 0xf8) * iVar11 >> 0x10);
        pout[lVar9 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar9 = lVar9 + 1;
      } while (count != (int)lVar9);
    }
    break;
  default:
    EVar8 = inf->blend;
    lVar9 = (long)EVar8;
    if (lVar9 < 0x21) {
      if ((BLEND_ICEMAP < EVar8) && (0 < count)) {
        iVar12 = 0x20 - EVar8;
        lVar9 = 0;
        do {
          uVar2 = *(ushort *)pin;
          uVar10 = (uint)uVar2 * 8 & 0xff;
          uVar15 = uVar2 >> 2 & 0xf8;
          uVar14 = uVar2 >> 7 & 0xf8;
          iVar11 = (uVar15 * 0x8f + uVar10 * 0x4d + uVar14 * 0x24 >> 8) * (EVar8 + BLEND_MODULATE);
          lVar13 = (long)(int)(uVar10 * iVar12 + iVar11) * 0x84210843;
          lVar5 = (long)(int)(uVar15 * iVar12 + iVar11) * 0x84210843;
          lVar6 = (long)(int)(uVar14 * iVar12 + iVar11) * 0x84210843;
          pout[lVar9 * 4 + 2] = (char)(uint)((ulong)lVar13 >> 0x24) - (char)(lVar13 >> 0x3f);
          pout[lVar9 * 4 + 1] = (char)(uint)((ulong)lVar5 >> 0x24) - (char)(lVar5 >> 0x3f);
          pout[lVar9 * 4] = (char)(uint)((ulong)lVar6 >> 0x24) - (char)(lVar6 >> 0x3f);
          pout[lVar9 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar9 = lVar9 + 1;
        } while (count != (int)lVar9);
      }
    }
    else if (0 < count) {
      lVar13 = 0;
      do {
        uVar2 = *(ushort *)pin;
        uVar10 = (uVar2 >> 2 & 0xf8) * 0x8f + ((uint)uVar2 * 8 & 0xff) * 0x4d +
                 (uVar2 >> 7 & 0xf8) * 0x24;
        uVar14 = uVar10 >> 8;
        if (0xfe < uVar14) {
          uVar14 = 0xff;
        }
        uVar16 = (ulong)uVar14;
        if (uVar10 < 0x100) {
          uVar16 = 0;
        }
        uVar3 = *(undefined2 *)((long)pFVar7 + uVar16 * 4 + lVar9 * 0x518 + -0xa700);
        pout[lVar13 * 4 + 2] = *(BYTE *)((long)pFVar7 + uVar16 * 4 + lVar9 * 0x518 + -0xa6fe);
        *(undefined2 *)(pout + lVar13 * 4) = uVar3;
        pout[lVar13 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar13 = lVar13 + 1;
      } while (count != (int)lVar13);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}